

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O2

bool llvm::formatv_object_base::consumeFieldLayout
               (StringRef *Spec,AlignStyle *Where,size_t *Align,char *Pad)

{
  char cVar1;
  type_conflict1 tVar2;
  AlignStyle *pAVar3;
  StringRef SVar4;
  size_t sStack_40;
  OptionalStorage<llvm::AlignStyle,_true> local_38;
  Optional<llvm::AlignStyle> Loc;
  Optional<llvm::AlignStyle> Loc_1;
  
  *Where = Right;
  *Align = 0;
  *Pad = ' ';
  if (Spec->Length == 0) {
    return true;
  }
  if (Spec->Length != 1) {
    cVar1 = StringRef::operator[](Spec,1);
    local_38 = (OptionalStorage<llvm::AlignStyle,_true>)translateLocChar(cVar1);
    if (((ulong)local_38 >> 0x20 & 1) == 0) {
      cVar1 = StringRef::operator[](Spec,0);
      Loc = translateLocChar(cVar1);
      if (((ulong)Loc.Storage & 0x100000000) == 0) goto LAB_00db9f15;
      pAVar3 = optional_detail::OptionalStorage<llvm::AlignStyle,_true>::getValue(&Loc.Storage);
      *Where = *pAVar3;
      sStack_40 = 1;
    }
    else {
      cVar1 = StringRef::operator[](Spec,0);
      *Pad = cVar1;
      pAVar3 = optional_detail::OptionalStorage<llvm::AlignStyle,_true>::getValue(&local_38);
      *Where = *pAVar3;
      sStack_40 = 2;
    }
    SVar4 = StringRef::drop_front(Spec,sStack_40);
    *Spec = SVar4;
  }
LAB_00db9f15:
  tVar2 = StringRef::consumeInteger<unsigned_long>(Spec,0,Align);
  return !tVar2;
}

Assistant:

bool formatv_object_base::consumeFieldLayout(StringRef &Spec, AlignStyle &Where,
                                             size_t &Align, char &Pad) {
  Where = AlignStyle::Right;
  Align = 0;
  Pad = ' ';
  if (Spec.empty())
    return true;

  if (Spec.size() > 1) {
    // A maximum of 2 characters at the beginning can be used for something
    // other
    // than the width.
    // If Spec[1] is a loc char, then Spec[0] is a pad char and Spec[2:...]
    // contains the width.
    // Otherwise, if Spec[0] is a loc char, then Spec[1:...] contains the width.
    // Otherwise, Spec[0:...] contains the width.
    if (auto Loc = translateLocChar(Spec[1])) {
      Pad = Spec[0];
      Where = *Loc;
      Spec = Spec.drop_front(2);
    } else if (auto Loc = translateLocChar(Spec[0])) {
      Where = *Loc;
      Spec = Spec.drop_front(1);
    }
  }

  bool Failed = Spec.consumeInteger(0, Align);
  return !Failed;
}